

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O0

void test_ADynArray_appendADynArray_failure_nullptrDestArray_fn(int _i)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uintmax_t _ck_y_4;
  uintmax_t _ck_x_6;
  void *_ck_x_5;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_3;
  char *_ck_x_4;
  void *_ck_x_3;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_2;
  uintmax_t _ck_y_1;
  uintmax_t _ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  private_ACUtilsTest_ADynArray_CharArray *destArrayPtr;
  private_ACUtilsTest_ADynArray_CharArray srcArray;
  int _i_local;
  
  srcArray.buffer._4_4_ = _i;
  memcpy(&destArrayPtr,&PTR_private_ACUtilsTest_ADynArray_realloc_001a7f40,0x30);
  srcArray.growStrategy = (ACUtilsGrowStrategy)0x3;
  srcArray.deallocator = private_ACUtilsTest_ADynArray_growStrategy;
  srcArray.size = 8;
  private_ACUtilsTest_ADynArray_reallocFail = false;
  srcArray.capacity = (*(code *)destArrayPtr)(0,8);
  *(undefined4 *)srcArray.capacity = 0x323130;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  bVar1 = private_ACUtils_ADynArray_insertArray
                    ((void *)0x0,0xffffffffffffffff,(void *)srcArray.capacity,
                     (size_t)srcArray.growStrategy,1);
  if ((ulong)bVar1 != 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x636,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                      "(&srcArray == ((void*)0) ? destArrayPtr != ((void*)0) : private_ACUtils_ADynArray_insertArray(destArrayPtr, ((size_t)-1), (&srcArray)->buffer, (&srcArray)->size, sizeof(*(destArrayPtr)->buffer))) == false"
                      ,
                      "(&srcArray == ((void*)0) ? destArrayPtr != ((void*)0) : private_ACUtils_ADynArray_insertArray(destArrayPtr, ((size_t)-1), (&srcArray)->buffer, (&srcArray)->size, sizeof(*(destArrayPtr)->buffer)))"
                      ,(ulong)bVar1,"false",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x636);
  if (srcArray.growStrategy != (ACUtilsGrowStrategy)0x3) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x637,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","srcArray.size == 3",
                      "srcArray.size",srcArray.growStrategy,"3",3,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x637);
  if (srcArray.size != 8) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x638,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","srcArray.capacity == 8",
                      "srcArray.capacity",srcArray.size,"8",8,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x638);
  if (srcArray.capacity != 0) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x639);
    _ck_y_s = (char *)srcArray.capacity;
    if (srcArray.capacity == 0) {
      _ck_y_q = "";
      _ck_y_s = "(null)";
    }
    else {
      _ck_y_q = "\"";
      iVar2 = strcmp("012",(char *)srcArray.capacity);
      if (iVar2 == 0) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x63a);
        if (srcArray.deallocator == (ACUtilsDeallocator)0x0) {
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x63b,"Assertion \'_ck_x != NULL\' failed",
                            "Assertion \'%s\' failed: %s == %#x",
                            "(void*) srcArray.growStrategy != NULL","(void*) srcArray.growStrategy",
                            0,0);
        }
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x63b);
        if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
          sVar3 = 0x63c;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x63c);
          (*srcArray.reallocator)((void *)srcArray.capacity,sVar3);
          return;
        }
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x63c,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "private_ACUtilsTest_ADynArray_reallocCount == 0",
                          "private_ACUtilsTest_ADynArray_reallocCount",
                          private_ACUtilsTest_ADynArray_reallocCount,"0",0,0);
      }
    }
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x63a,
                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                      ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                      "srcArray.buffer == \"012\"","srcArray.buffer",_ck_y_q,_ck_y_s,_ck_y_q,
                      "\"012\"","\"","012","\"",0);
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x639,"Assertion \'_ck_x != NULL\' failed","Assertion \'%s\' failed: %s == %#x"
                    ,"(void*) srcArray.buffer != NULL","(void*) srcArray.buffer",0,0);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_appendADynArray_failure_nullptrDestArray)
{
    struct private_ACUtilsTest_ADynArray_CharArray srcArray = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    struct private_ACUtilsTest_ADynArray_CharArray *destArrayPtr = nullptr;
    srcArray.size = 3;
    srcArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    srcArray.capacity = 8;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    srcArray.buffer = (char*) srcArray.reallocator(nullptr, srcArray.capacity);
    memcpy(srcArray.buffer, "012", 4);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_appendADynArray(destArrayPtr, &srcArray), false);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.size, 3);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(srcArray.buffer, "012");
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    srcArray.deallocator(srcArray.buffer);
}